

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

ssize_t __thiscall phosg::BitWriter::write(BitWriter *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  char __c;
  size_type sVar2;
  bool v_local;
  BitWriter *this_local;
  
  if (this->last_byte_unset_bits == '\0') {
    __c = '\0';
    if ((__fd & 1U) != 0) {
      __c = -0x80;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__c);
    this->last_byte_unset_bits = '\a';
  }
  else {
    this->last_byte_unset_bits = this->last_byte_unset_bits + 0xff;
    if ((__fd & 1U) != 0) {
      bVar1 = this->last_byte_unset_bits;
      sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(&this->data);
      this = (BitWriter *)
             ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](&this->data,sVar2 - 1);
      *(byte *)&(this->data)._M_dataplus._M_p =
           *(byte *)&(this->data)._M_dataplus._M_p | (byte)(1 << (bVar1 & 0x1f));
    }
  }
  return (ssize_t)this;
}

Assistant:

void BitWriter::write(bool v) {
  if (this->last_byte_unset_bits > 0) {
    this->last_byte_unset_bits--;
    if (v) {
      this->data[this->data.size() - 1] |= (1 << this->last_byte_unset_bits);
    }
  } else {
    this->data.push_back(v ? 0x80 : 0x00);
    this->last_byte_unset_bits = 7;
  }
}